

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void cashew::ValueBuilder::appendCodeToSwitch(Ref switch_,Ref code,bool explicitBlock)

{
  bool bVar1;
  Ref *pRVar2;
  Ref RVar3;
  Value *pVVar4;
  ulong uVar5;
  Ref local_38;
  Ref switch__local;
  Ref code_local;
  
  local_38.inst = switch_.inst;
  switch__local = code;
  pRVar2 = Ref::operator[](&local_38,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)&SWITCH);
  if (!bVar1) {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6f1,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
  }
  pRVar2 = Ref::operator[](&switch__local,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)&BLOCK);
  if (bVar1) {
    if (explicitBlock) {
      pRVar2 = Ref::operator[](&local_38,2);
      RVar3 = cashew::Value::back(pRVar2->inst);
      RVar3 = cashew::Value::back(RVar3.inst);
      cashew::Value::push_back(RVar3.inst,switch__local);
      return;
    }
    pRVar2 = Ref::operator[](&switch__local,1);
    pVVar4 = pRVar2->inst;
    if (pVVar4->type == Array) {
      uVar5 = 0;
      do {
        if ((((pVVar4->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
            usedElements <= uVar5) {
          return;
        }
        pRVar2 = Ref::operator[](&local_38,2);
        RVar3 = cashew::Value::back(pRVar2->inst);
        RVar3 = cashew::Value::back(RVar3.inst);
        pRVar2 = Ref::operator[](&switch__local,1);
        pRVar2 = Ref::operator[](pRVar2,(uint)uVar5);
        cashew::Value::push_back(RVar3.inst,pRVar2->inst);
        uVar5 = uVar5 + 1;
        pRVar2 = Ref::operator[](&switch__local,1);
        pVVar4 = pRVar2->inst;
      } while (pVVar4->type == Array);
    }
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x199,"size_t cashew::Value::size()");
  }
  __assert_fail("code[0] == BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6f2,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
}

Assistant:

static void appendCodeToSwitch(Ref switch_, Ref code, bool explicitBlock) {
    assert(switch_[0] == SWITCH);
    assert(code[0] == BLOCK);
    if (!explicitBlock) {
      for (size_t i = 0; i < code[1]->size(); i++) {
        switch_[2]->back()->back()->push_back(code[1][i]);
      }
    } else {
      switch_[2]->back()->back()->push_back(code);
    }
  }